

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

void fixToolBarOrientation(QLayoutItem *item,int dockPos)

{
  QRect *pQVar1;
  int iVar2;
  int iVar3;
  Representation RVar4;
  QWidgetData *pQVar5;
  undefined8 uVar6;
  Orientation OVar7;
  LayoutDirection LVar8;
  QWidget *this;
  QSize QVar9;
  QSize QVar10;
  QSize QVar11;
  Representation RVar12;
  Orientation orientation;
  Representation RVar13;
  long in_FS_OFFSET;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (*item->_vptr_QLayoutItem[0xd])();
  this = (QWidget *)QMetaObject::cast((QObject *)&QToolBar::staticMetaObject);
  if (this != (QWidget *)0x0) {
    pQVar5 = this->data;
    pQVar1 = &pQVar5->crect;
    iVar2 = (pQVar1->x1).m_i;
    iVar3 = (pQVar5->crect).y1.m_i;
    uVar6._0_4_ = (pQVar1->x1).m_i;
    uVar6._4_4_ = (pQVar1->y1).m_i;
    RVar4.m_i = (pQVar5->crect).x2.m_i;
    orientation = ((dockPos & 0xfffffffeU) != 2) + Horizontal;
    OVar7 = QToolBar::orientation((QToolBar *)this);
    if (orientation != OVar7) {
      QToolBar::setOrientation((QToolBar *)this,orientation);
    }
    QVar9 = (QSize)(**(code **)(*(long *)this + 0x70))(this);
    QVar10 = QWidget::maximumSize(this);
    QVar11 = QVar10;
    if (QVar9.wd.m_i.m_i < QVar10.wd.m_i.m_i) {
      QVar11 = QVar9;
    }
    RVar12.m_i = QVar10.ht.m_i.m_i;
    if (QVar9.ht.m_i.m_i < QVar10.ht.m_i.m_i) {
      RVar12.m_i = QVar9.ht.m_i.m_i;
    }
    QVar9 = QWidget::minimumSize(this);
    RVar13.m_i = QVar11.wd.m_i.m_i;
    if (QVar11.wd.m_i.m_i <= QVar9.wd.m_i.m_i) {
      RVar13.m_i = QVar9.wd.m_i.m_i;
    }
    if (RVar12.m_i <= QVar9.ht.m_i.m_i) {
      RVar12.m_i = QVar9.ht.m_i.m_i;
    }
    pQVar5 = this->data;
    if ((((pQVar5->crect).x2.m_i - (pQVar5->crect).x1.m_i) + 1 != RVar13.m_i) ||
       (((pQVar5->crect).y2.m_i - (pQVar5->crect).y1.m_i) + 1 != RVar12.m_i)) {
      local_48.y2.m_i = iVar3 + RVar12.m_i + -1;
      local_48.x2.m_i = iVar2 + -1 + RVar13.m_i;
      local_48._0_8_ = uVar6;
      LVar8 = QWidget::layoutDirection(this);
      if (LVar8 == RightToLeft) {
        local_48.x1.m_i = local_48.x1.m_i + (RVar4.m_i - local_48.x2.m_i);
        local_48.x2.m_i = RVar4.m_i;
      }
      QWidget::setGeometry(this,&local_48);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void fixToolBarOrientation(QLayoutItem *item, int dockPos)
{
#if QT_CONFIG(toolbar)
    QToolBar *toolBar = qobject_cast<QToolBar*>(item->widget());
    if (toolBar == nullptr)
        return;

    QRect oldGeo = toolBar->geometry();

    QInternal::DockPosition pos
        = static_cast<QInternal::DockPosition>(dockPos);
    Qt::Orientation o = pos == QInternal::TopDock || pos == QInternal::BottomDock
                        ? Qt::Horizontal : Qt::Vertical;
    if (o != toolBar->orientation())
        toolBar->setOrientation(o);

    QSize hint = toolBar->sizeHint().boundedTo(toolBar->maximumSize())
                    .expandedTo(toolBar->minimumSize());

    if (toolBar->size() != hint) {
        QRect newGeo(oldGeo.topLeft(), hint);
        if (toolBar->layoutDirection() == Qt::RightToLeft)
            newGeo.moveRight(oldGeo.right());
        toolBar->setGeometry(newGeo);
    }

#else
    Q_UNUSED(item);
    Q_UNUSED(dockPos);
#endif
}